

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<char[13],int,int,int,char[42]>
               (ostream *out,char *fmt,char (*args) [13],int *args_1,int *args_2,int *args_3,
               char (*args_4) [42])

{
  char (*in_RCX) [13];
  char (*in_RSI) [42];
  FormatListRef in_RDI;
  int *in_R8;
  int *in_R9;
  long in_FS_OFFSET;
  ostream *out_00;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  out_00 = (ostream *)&stack0xffffffffffffff70;
  makeFormatList<char[13],int,int,int,char[42]>(in_RCX,in_R8,in_R9,(int *)out_00,in_RSI);
  vformat(out_00,*in_RSI,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}